

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

int __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::link(SessionImpl *this,char *__from,char *__to)

{
  undefined8 extraout_RAX;
  anon_class_240_3_a0b0fe3a local_130;
  TaskFunction local_40;
  char *local_20;
  CompileTaskFinishedCallback *linkFinishedCallback_local;
  BuildSettings *settings_local;
  SessionImpl *this_local;
  
  local_130.this = this;
  local_20 = __to;
  linkFinishedCallback_local = (CompileTaskFinishedCallback *)__from;
  settings_local = (BuildSettings *)this;
  BuildSettings::BuildSettings(&local_130.settings,(BuildSettings *)__from);
  std::function<void_(const_soul::CompileMessageList_&)>::function
            (&local_130.callback,(function<void_(const_soul::CompileMessageList_&)> *)__to);
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::SessionImpl::link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)&local_40,&local_130);
  TaskThread::Queue::addTask(&this->taskQueue,&local_40);
  std::function<void_(std::atomic<int>_&)>::~function(&local_40);
  link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::
  {lambda(std::atomic<int>&)#1}::~atomic((_lambda_std__atomic<int>___1_ *)&local_130);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool link (const BuildSettings& settings, CompileTaskFinishedCallback linkFinishedCallback) override
        {
            taskQueue.addTask ([this, settings, callback = std::move (linkFinishedCallback)] (TaskThread::ShouldStopFlag& cancelled)
            {
                if (state == SessionState::loaded)
                {
                    CompileMessageList messageList;
                    bool ok = performer->link (messageList, settings, {});

                    if (cancelled)
                        return;

                    maxBlockSize = performer->getBlockSize();
                    SOUL_ASSERT (maxBlockSize != 0);
                    callback (messageList);

                    if (ok)
                        setState (SessionState::linked);
                }
            });

            return true;
        }